

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLTextureBuffer::GLTextureBuffer
          (GLTextureBuffer *this,TextureFormat format_,uint size1D,float *data)

{
  TextureFormat *x;
  PFNGLTEXIMAGE1DPROC p_Var1;
  GLenum GVar2;
  GLenum GVar3;
  
  TextureBuffer::TextureBuffer(&this->super_TextureBuffer,1,format_,size1D,0xffffffff);
  (this->super_TextureBuffer)._vptr_TextureBuffer = (_func_int **)&PTR__GLTextureBuffer_0047dfa0;
  (*glad_glGenTextures)(1,&this->handle);
  (*glad_glBindTexture)(0xde0,this->handle);
  p_Var1 = glad_glTexImage1D;
  x = &(this->super_TextureBuffer).format;
  GVar2 = internalFormat(x);
  GVar3 = formatF(x);
  (*p_Var1)(0xde0,0,GVar2,size1D,0,GVar3,0x1406,data);
  checkGLError(true);
  (*(this->super_TextureBuffer)._vptr_TextureBuffer[4])(this,0);
  return;
}

Assistant:

GLTextureBuffer::GLTextureBuffer(TextureFormat format_, unsigned int size1D, float* data)
    : TextureBuffer(1, format_, size1D) {

  glGenTextures(1, &handle);
  glBindTexture(GL_TEXTURE_1D, handle);
  glTexImage1D(GL_TEXTURE_1D, 0, internalFormat(format), size1D, 0, formatF(format), GL_FLOAT, data);
  checkGLError();

  setFilterMode(FilterMode::Nearest);
}